

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

TaggedStringPtr __thiscall
google::protobuf::internal::TaggedStringPtr::ForceCopy(TaggedStringPtr *this,Arena *arena)

{
  size_t sVar1;
  Arena *arena_00;
  size_t *psVar2;
  TaggedStringPtr TVar3;
  string *psVar4;
  string *psVar5;
  char *in_RCX;
  string_view s;
  LogMessageFatal local_30 [16];
  
  psVar2 = (size_t *)((ulong)this->ptr_ & 0xfffffffffffffffc);
  sVar1 = *psVar2;
  arena_00 = (Arena *)psVar2[1];
  if (arena != (Arena *)0x0) {
    s._M_str = in_RCX;
    s._M_len = sVar1;
    TVar3 = anon_unknown_7::CreateArenaString((anon_unknown_7 *)arena,arena_00,s);
    return (TaggedStringPtr)TVar3.ptr_;
  }
  psVar4 = (string *)operator_new(0x20);
  *(string **)psVar4 = psVar4 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar4,sVar1,(long)&(arena_00->impl_).tag_and_id_ + sVar1);
  if (((ulong)psVar4 & 3) == 0) {
    psVar5 = (string *)0x0;
  }
  else {
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((ulong)psVar4 & 3,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
  }
  if (psVar5 == (string *)0x0) {
    return (TaggedStringPtr)(void *)((ulong)psVar4 | 2);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arenastring.h"
             ,0xbe,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

std::string* ArenaStringPtr::Release() {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) return nullptr;

  std::string* released = tagged_ptr_.Get();
  if (tagged_ptr_.IsArena()) {
    released = tagged_ptr_.IsMutable() ? new std::string(std::move(*released))
                                       : new std::string(*released);
  }
  InitDefault();
  return released;
}